

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::SetEnumerable
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,PropertyId propertyId,BOOL value)

{
  bool bVar1;
  BOOL BVar2;
  int iVar3;
  DynamicTypeHandler *pDVar4;
  uint32 local_44;
  ScriptContext *pSStack_40;
  uint32 indexVal;
  PropertyIndex local_32 [4];
  PropertyIndex index;
  
  BVar2 = GetDescriptor(this,propertyId,local_32);
  if (BVar2 == 0) {
    pSStack_40 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr;
    bVar1 = DynamicObject::HasObjectArray(instance);
    iVar3 = 1;
    if (bVar1) {
      BVar2 = ScriptContext::IsNumericPropertyId(pSStack_40,propertyId,&local_44);
      if (BVar2 != 0) {
        pDVar4 = ConvertToTypeWithItemAttributes(this,instance);
        iVar3 = (*pDVar4->_vptr_DynamicTypeHandler[0x29])
                          (pDVar4,instance,(ulong)(uint)propertyId,(ulong)(uint)value);
      }
    }
  }
  else {
    iVar3 = 1;
    if (value == 0) {
      ClearAttribute(this,instance,local_32[0],'\x01');
    }
    else {
      BVar2 = SetAttribute(this,instance,local_32[0],'\x01');
      if (BVar2 != 0) {
        DynamicObject::SetHasNoEnumerableProperties(instance,false);
      }
    }
  }
  return iVar3;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetEnumerable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        PropertyIndex index;
        if (!GetDescriptor(propertyId, &index))
        {
            // Upgrade type handler if set objectArray item attribute.
            // Only check numeric propertyId if objectArray available.
            ScriptContext* scriptContext = instance->GetScriptContext();
            uint32 indexVal;
            if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
            {
                return SimpleTypeHandler<size>::ConvertToTypeWithItemAttributes(instance)
                    ->SetEnumerable(instance, propertyId, value);
            }
            return true;
        }

        if (value)
        {
            if (SetAttribute(instance, index, PropertyEnumerable))
            {
                instance->SetHasNoEnumerableProperties(false);
            }
        }
        else
        {
            ClearAttribute(instance, index, PropertyEnumerable);
        }
        return true;
    }